

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O2

void aom_highbd_h_predictor_8x4_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar3 = *(undefined1 (*) [16])left;
  auVar4 = pshuflw(in_XMM1,auVar3,0);
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  *(undefined1 (*) [16])dst = auVar4;
  auVar4 = pshuflw(auVar4,auVar3,0x55);
  auVar5._0_4_ = auVar4._0_4_;
  auVar5._4_4_ = auVar5._0_4_;
  auVar5._8_4_ = auVar5._0_4_;
  auVar5._12_4_ = auVar5._0_4_;
  *(undefined1 (*) [16])(dst + stride) = auVar5;
  puVar1 = (uint16_t *)((long)*(undefined1 (*) [16])(dst + stride) + stride * 2);
  auVar4 = pshuflw(auVar5,auVar3,0xaa);
  uVar2 = auVar4._0_4_;
  *(undefined4 *)puVar1 = uVar2;
  *(undefined4 *)(puVar1 + 2) = uVar2;
  *(undefined4 *)(puVar1 + 4) = uVar2;
  *(undefined4 *)(puVar1 + 6) = uVar2;
  auVar3 = pshuflw(auVar3,auVar3,0xff);
  uVar2 = auVar3._0_4_;
  puVar1 = puVar1 + stride;
  *(undefined4 *)puVar1 = uVar2;
  *(undefined4 *)(puVar1 + 2) = uVar2;
  *(undefined4 *)(puVar1 + 4) = uVar2;
  *(undefined4 *)(puVar1 + 6) = uVar2;
  return;
}

Assistant:

void aom_highbd_h_predictor_8x4_sse2(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  const __m128i left_u16 = _mm_load_si128((const __m128i *)left);
  const __m128i row0 = _mm_shufflelo_epi16(left_u16, 0x0);
  const __m128i row1 = _mm_shufflelo_epi16(left_u16, 0x55);
  const __m128i row2 = _mm_shufflelo_epi16(left_u16, 0xaa);
  const __m128i row3 = _mm_shufflelo_epi16(left_u16, 0xff);
  (void)above;
  (void)bd;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row0, row0));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row1, row1));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row2, row2));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row3, row3));
}